

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
AssertCheckHeapBlockNotInAnyList
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  undefined8 *in_FS_OFFSET;
  bool bVar5;
  
  pSVar4 = this->heapBlockList;
  bVar5 = pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  if (pSVar4 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar4 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock)
        ;
      }
      bVar5 = pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    } while ((pSVar4 != heapBlock) &&
            (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19e,"(!HeapBlockList::Contains(heapBlock, heapBlockList))",
                       "The heap block already exists in the heapBlockList.");
    if (!bVar5) goto LAB_00224840;
    *puVar2 = 0;
  }
  pSVar4 = this->fullBlockList;
  bVar5 = pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  if (pSVar4 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar4 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock)
        ;
      }
      bVar5 = pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    } while ((pSVar4 != heapBlock) &&
            (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19f,"(!HeapBlockList::Contains(heapBlock, fullBlockList))",
                       "The heap block already exists in the fullBlockList.");
    if (!bVar5) goto LAB_00224840;
    *puVar2 = 0;
  }
  pSVar4 = this->emptyBlockList;
  bVar5 = pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  if (pSVar4 != heapBlock && bVar5) {
    do {
      pSVar1 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar4 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock)
        ;
      }
      bVar5 = pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    } while ((pSVar4 != heapBlock) &&
            (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0));
  }
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1a0,"(!HeapBlockList::Contains(heapBlock, emptyBlockList))",
                       "The heap block already exists in the emptyBlockList.");
    if (!bVar5) {
LAB_00224840:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AssertCheckHeapBlockNotInAnyList(TBlockType * heapBlock)
{
#if DBG
    AssertMsg(!HeapBlockList::Contains(heapBlock, heapBlockList), "The heap block already exists in the heapBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, fullBlockList), "The heap block already exists in the fullBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, emptyBlockList), "The heap block already exists in the emptyBlockList.");
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    AssertMsg(!HeapBlockList::Contains(heapBlock, sweepableHeapBlockList), "The heap block already exists in the sweepableHeapBlockList.");
#endif
#endif
}